

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkComputePathsD(Acb_Ntk_t *p,Vec_Int_t *vTfo,int fReverse)

{
  int iVar1;
  int iVar2;
  int local_28;
  int Path;
  int iObj;
  int i;
  int fReverse_local;
  Vec_Int_t *vTfo_local;
  Acb_Ntk_t *p_local;
  
  local_28 = 0;
  iVar1 = Acb_NtkHasObjPathD(p);
  if (iVar1 == 0) {
    Acb_NtkCleanObjPathD(p);
  }
  if (fReverse == 0) {
    for (Path = 0; iVar1 = Vec_IntSize(vTfo), Path < iVar1; Path = Path + 1) {
      iVar1 = Vec_IntEntry(vTfo,Path);
      iVar2 = Acb_ObjIsCi(p,iVar1);
      if (iVar2 == 0) {
        iVar2 = Acb_ObjSlack(p,iVar1);
        if (iVar2 == 0) {
          Acb_ObjComputePathD(p,iVar1);
        }
        else {
          Acb_ObjSetPathD(p,iVar1,0);
        }
      }
      else {
        iVar2 = Acb_ObjSlack(p,iVar1);
        Acb_ObjSetPathD(p,iVar1,(uint)(iVar2 == 0));
      }
    }
  }
  else {
    Path = Vec_IntSize(vTfo);
    while (Path = Path + -1, -1 < Path) {
      iVar1 = Vec_IntEntry(vTfo,Path);
      iVar2 = Acb_ObjIsCi(p,iVar1);
      if (iVar2 == 0) {
        iVar2 = Acb_ObjSlack(p,iVar1);
        if (iVar2 == 0) {
          Acb_ObjComputePathD(p,iVar1);
        }
        else {
          Acb_ObjSetPathD(p,iVar1,0);
        }
      }
      else {
        iVar2 = Acb_ObjSlack(p,iVar1);
        Acb_ObjSetPathD(p,iVar1,(uint)(iVar2 == 0));
      }
    }
  }
  for (Path = 0; iVar1 = Acb_NtkCoNum(p), Path < iVar1; Path = Path + 1) {
    iVar1 = Acb_NtkCo(p,Path);
    iVar1 = Acb_ObjPathD(p,iVar1);
    local_28 = iVar1 + local_28;
  }
  p->nPaths = local_28;
  return local_28;
}

Assistant:

int Acb_NtkComputePathsD( Acb_Ntk_t * p, Vec_Int_t * vTfo, int fReverse )
{
    int i, iObj, Path = 0;
    //Vec_IntPrint( vTfo );
    if ( !Acb_NtkHasObjPathD( p ) )
        Acb_NtkCleanObjPathD( p );
    // it is assumed that vTfo contains CI nodes
    //assert( Acb_ObjSlack(p, Vec_IntEntry(vTfo, 0)) );
    if ( fReverse )
    {
        Vec_IntForEachEntryReverse( vTfo, iObj, i )
        {
            if ( Acb_ObjIsCi(p, iObj) )
                Acb_ObjSetPathD( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathD( p, iObj, 0 );
            else
                Acb_ObjComputePathD( p, iObj );
        }
    }
    else
    {
        Vec_IntForEachEntry( vTfo, iObj, i )
        {
            if ( Acb_ObjIsCi(p, iObj) )
                Acb_ObjSetPathD( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathD( p, iObj, 0 );
            else
                Acb_ObjComputePathD( p, iObj );
        }
    }
    Acb_NtkForEachCo( p, iObj, i )
        Path += Acb_ObjPathD(p, iObj);
    p->nPaths = Path;
    return Path;
}